

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O0

bool __thiscall Gnuplot::file_available(Gnuplot *this,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  GnuplotException *this_00;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream except;
  string *filename_local;
  Gnuplot *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  bVar1 = file_exists(this,filename,0);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)local_190,"File \"");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::operator<<(poVar2,"\" does not exist");
    this_00 = (GnuplotException *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    GnuplotException::GnuplotException(this_00,&local_1c0);
    __cxa_throw(this_00,&GnuplotException::typeinfo,GnuplotException::~GnuplotException);
  }
  file_exists(this,filename,4);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return false;
}

Assistant:

bool Gnuplot::file_available(const std::string &filename) {
  std::ostringstream except;
  if (Gnuplot::file_exists(filename, 0)) {   // check existence
    if (!(Gnuplot::file_exists(filename, 4))) {   // check read permission
// except << "No read permission for File \"" << filename << "\"";
// throw GnuplotException(except.str());
// return false;
    }
  } else {
    except << "File \"" << filename << "\" does not exist";
    throw GnuplotException(except.str());
    return false;
  }
  return false;
}